

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  int iVar1;
  XmlWriter *this_00;
  string local_90;
  undefined1 local_70 [8];
  timeval t;
  string local_50;
  
  Option<Catch::TestCaseInfo>::operator=
            (&(this->super_StreamingReporterBase).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>,testInfo);
  (this->super_StreamingReporterBase).currentTestCaseInfo.used = false;
  local_70 = (undefined1  [8])&t.tv_usec;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"TestCase","");
  this_00 = XmlWriter::startElement(&this->m_xml,(string *)local_70);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"name","");
  trim(&local_90,&testInfo->name);
  XmlWriter::writeAttribute(this_00,&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != (undefined1  [8])&t.tv_usec) {
    operator_delete((void *)local_70,t.tv_usec + 1);
  }
  iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    gettimeofday((timeval *)local_70,(__timezone_ptr_t)0x0);
    (this->m_testCaseTimer).m_ticks = (long)local_70 * 1000000 + t.tv_sec;
  }
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseStarting(testInfo);
            m_xml.startElement( "TestCase" ).writeAttribute( "name", trim( testInfo.name ) );

            if ( m_config->showDurations() == ShowDurations::Always )
                m_testCaseTimer.start();
        }